

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int pattern_search(FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int search_step,
                  int do_init_search,int *cost_list,FULLPEL_MV *best_mv,
                  FULLPEL_MV_STATS *best_mv_stats)

{
  byte bVar1;
  MV_COST_TYPE MVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  FULLPEL_MV *best_mv_00;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  short sVar10;
  ushort uVar11;
  FULLPEL_MV FVar12;
  short sVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  buf_2d *pbVar17;
  int iVar18;
  uint uVar19;
  ushort uVar20;
  int iVar21;
  ulong uVar22;
  FULLPEL_MOTION_SEARCH_PARAMS *ms_params_00;
  ushort uVar23;
  uint8_t *puVar24;
  ushort uVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  int i_1;
  int iVar30;
  MV_COST_PARAMS *pMVar31;
  buf_2d *pbVar32;
  int i;
  uint uVar33;
  ulong uVar34;
  char cVar35;
  uint *puVar36;
  int best_site_1;
  uint local_b0;
  uint local_ac;
  search_site_config *local_a8;
  uint *local_a0;
  FULLPEL_MV local_94;
  uint8_t *local_90;
  uint local_88;
  int best_site;
  int local_80;
  int local_7c;
  ulong local_78;
  FULLPEL_MV *local_70;
  FULLPEL_MOTION_SEARCH_PARAMS *local_68;
  MV_COST_PARAMS *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  
  pbVar32 = (ms_params->ms_buffers).ref;
  pbVar17 = (ms_params->ms_buffers).src;
  local_a8 = ms_params->search_sites;
  iVar6 = pbVar32->stride;
  iVar18 = local_a8->searches_per_step[0];
  iVar30 = 10;
  if (search_step < 10) {
    iVar30 = search_step;
  }
  local_88 = pattern_search::search_steps[iVar30];
  uVar15 = (uint)start_mv.row;
  iVar21 = (int)start_mv >> 0x10;
  iVar30 = (ms_params->mv_limits).col_max;
  if (iVar21 < iVar30) {
    iVar30 = iVar21;
  }
  iVar5 = (ms_params->mv_limits).col_min;
  if (iVar21 < iVar5) {
    iVar30 = iVar5;
  }
  uVar7 = (ms_params->mv_limits).row_max;
  if ((int)uVar15 < (int)uVar7) {
    uVar7 = uVar15;
  }
  uVar33 = (ms_params->mv_limits).row_min;
  if ((int)uVar15 < (int)uVar33) {
    uVar7 = uVar33;
  }
  sVar13 = (short)uVar7;
  local_78 = (ulong)(uint)(int)sVar13;
  uVar15 = (uint)(short)iVar30;
  uVar22 = (ulong)uVar15;
  iVar21 = iVar6;
  if (cost_list != (int *)0x0) {
    cost_list[4] = 0x7fffffff;
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
    iVar21 = pbVar32->stride;
  }
  puVar36 = (uint *)0x1db56d;
  local_a0 = (uint *)cost_list;
  local_68 = ms_params;
  local_54 = do_init_search;
  local_b0 = (*ms_params->sdf)(pbVar17->buf,pbVar17->stride,
                               pbVar32->buf + (int)(iVar21 * sVar13 + uVar15),iVar6);
  bVar1 = (local_68->mv_cost_params).mv_cost_type;
  if (bVar1 < 4) {
    sVar13 = sVar13 - (local_68->mv_cost_params).full_ref_mv.row;
    uVar14 = sVar13 * 8;
    sVar10 = (short)iVar30 - (local_68->mv_cost_params).full_ref_mv.col;
    uVar11 = sVar10 * 8;
    switch(bVar1) {
    case 0:
      local_ac = ((local_68->mv_cost_params).mvcost[0][(short)uVar14] +
                  *(int *)((long)(local_68->mv_cost_params).mvjcost +
                          (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar14 != 0) * 8)) +
                 (local_68->mv_cost_params).mvcost[1][(short)uVar11]) *
                 (local_68->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar14 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar14 = uVar11;
      }
      local_ac = ((uint)uVar14 + (uint)uVar23) * 4;
      break;
    case 2:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar14 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar14 = uVar11;
      }
      local_ac = ((uint)uVar14 + (uint)uVar23) * 0xf >> 3;
      break;
    case 3:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar14 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar14 = uVar11;
      }
      local_ac = (uint)uVar14 + (uint)uVar23;
    }
  }
  else {
    local_ac = 0;
  }
  pMVar31 = &local_68->mv_cost_params;
  local_ac = local_ac + local_b0;
  puVar24 = pbVar32->buf + (int)(pbVar32->stride * (int)local_78 + uVar15);
  local_70 = best_mv;
  local_60 = pMVar31;
  local_34 = iVar18;
  if (local_54 == 0) {
    uVar16 = 0xffffffff;
    uVar34 = local_78;
    uVar15 = local_88;
  }
  else {
    local_94 = (FULLPEL_MV)(uVar7 & 0xffff | iVar30 << 0x10);
    uVar34 = 0;
    uVar15 = local_88;
    if ((int)local_88 < 1) {
      uVar15 = 0;
    }
    local_40 = (ulong)(uVar15 + 1);
    uVar16 = 0xffffffff;
    uVar15 = 0xffffffff;
    local_90 = puVar24;
    local_50 = uVar22;
    do {
      best_mv_00 = local_70;
      best_site = -1;
      uVar33 = (uint)uVar34;
      iVar6 = 1 << ((byte)uVar34 & 0x1f);
      uVar7 = local_a8->searches_per_step[uVar34];
      if (((((int)local_78 - iVar6 < (local_68->mv_limits).row_min) ||
           ((local_68->mv_limits).row_max < iVar6 + (int)local_78)) ||
          ((int)uVar22 - iVar6 < (local_68->mv_limits).col_min)) ||
         ((local_68->mv_limits).col_max < iVar6 + (int)uVar22)) {
        uVar19 = 0;
      }
      else {
        iVar6 = (int)uVar7 >> 2;
        uVar19 = uVar7;
        if (0 < iVar6) {
          iVar18 = 0;
          local_88 = uVar15;
          local_48 = (ulong)uVar7;
          do {
            calc_sad4_update_bestmv
                      (local_68,pMVar31,best_mv_00,local_94,local_90,&local_ac,&local_b0,uVar33,
                       &best_site,iVar18,(int *)0x0);
            iVar18 = iVar18 + 4;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          uVar7 = local_a8->searches_per_step[uVar34];
          uVar19 = (uint)local_48;
          uVar22 = local_50;
          uVar15 = local_88;
        }
        uVar7 = (int)uVar7 % 4;
        uVar19 = uVar19 & 0xfffffffc;
        best_mv = local_70;
      }
      puVar36 = (uint *)0x0;
      iVar6 = (int)uVar22;
      calc_sad_update_bestmv
                (local_68,pMVar31,best_mv,local_94,local_90,&local_ac,&local_b0,uVar33,&best_site,
                 uVar7,uVar19,(int *)0x0);
      if (best_site != -1) {
        uVar16 = (ulong)(uint)best_site;
        uVar15 = uVar33;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != local_40);
    if (uVar15 == 0xffffffff) {
      cVar35 = '\x01';
      ms_params_00 = local_68;
      uVar34 = local_78;
      goto LAB_001dbe5f;
    }
    iVar18 = (int)uVar16;
    uVar22 = (ulong)(uint)(iVar6 + local_a8->site[(int)uVar15][iVar18].mv.col);
    puVar24 = local_90 + local_a8->site[(int)uVar15][iVar18].offset;
    uVar34 = (ulong)(uint)((int)local_78 + (int)local_a8->site[(int)uVar15][iVar18].mv.row);
  }
  FVar12.row._0_1_ = local_34 == 4 && local_a0 != (uint *)0x0;
  best_site_1 = -1;
  ms_params_00 = local_68;
  uVar7 = uVar15;
  if ((int)(uint)FVar12.row._0_1_ <= (int)uVar15) {
    uVar8 = (ulong)uVar15;
    FVar12._1_3_ = 0;
    local_94 = FVar12;
    local_88 = uVar15;
    local_40 = uVar8;
    do {
      iVar18 = (int)uVar8;
      iVar6 = 1 << ((byte)uVar8 & 0x1f);
      if ((local_54 != 0) && (uVar8 == local_40)) goto LAB_001dbaae;
      uVar7 = (uint)uVar34;
      uVar15 = local_a8->searches_per_step[uVar8];
      iVar30 = (int)uVar22;
      local_90 = puVar24;
      local_78 = uVar34;
      local_50 = uVar22;
      if ((((int)(uVar7 - iVar6) < (ms_params_00->mv_limits).row_min) ||
          (((ms_params_00->mv_limits).row_max < (int)(uVar7 + iVar6) ||
           (iVar30 - iVar6 < (ms_params_00->mv_limits).col_min)))) ||
         ((ms_params_00->mv_limits).col_max < iVar30 + iVar6)) {
        FVar12 = (FULLPEL_MV)(uVar7 & 0xffff | iVar30 << 0x10);
        uVar7 = 0;
      }
      else {
        iVar21 = (int)uVar15 >> 2;
        FVar12 = (FULLPEL_MV)(uVar7 & 0xffff | iVar30 << 0x10);
        local_48 = (ulong)uVar15;
        if (0 < iVar21) {
          iVar30 = 0;
          do {
            calc_sad4_update_bestmv
                      (local_68,local_60,local_70,FVar12,local_90,&local_ac,&local_b0,iVar18,
                       &best_site_1,iVar30,(int *)0x0);
            iVar30 = iVar30 + 4;
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
          uVar15 = local_a8->searches_per_step[uVar8];
          ms_params_00 = local_68;
          pMVar31 = local_60;
        }
        uVar15 = (int)uVar15 % 4;
        uVar7 = (uint)local_48 & 0xfffffffc;
      }
      puVar36 = (uint *)0x0;
      calc_sad_update_bestmv
                (ms_params_00,pMVar31,local_70,FVar12,local_90,&local_ac,&local_b0,iVar18,
                 &best_site_1,uVar15,uVar7,(int *)0x0);
      lVar9 = (long)best_site_1;
      puVar24 = local_90;
      uVar34 = local_78;
      uVar22 = local_50;
      if (lVar9 != -1) {
        uVar15 = (int)local_78 + (int)local_a8->site[uVar8][lVar9].mv.row;
        uVar7 = (int)local_50 + (int)local_a8->site[uVar8][lVar9].mv.col;
        puVar24 = local_90 + local_a8->site[uVar8][lVar9].offset;
        uVar16 = (ulong)(uint)best_site_1;
        while( true ) {
          uVar22 = (ulong)uVar7;
          uVar34 = (ulong)uVar15;
LAB_001dbaae:
          best_site_1 = -1;
          local_80 = (int)uVar16;
          iVar30 = local_80;
          if (local_80 == 0) {
            iVar30 = local_a8->searches_per_step[uVar8];
          }
          best_site = iVar30 + -1;
          local_7c = local_80 + 1;
          if (local_80 == local_a8->searches_per_step[uVar8] + -1) {
            local_7c = 0;
          }
          uVar15 = (uint)uVar34;
          iVar30 = (int)uVar22;
          FVar12 = (FULLPEL_MV)(uVar15 & 0xffff | iVar30 << 0x10);
          if (((((int)(uVar15 - iVar6) < (ms_params_00->mv_limits).row_min) ||
               ((ms_params_00->mv_limits).row_max < (int)(uVar15 + iVar6))) ||
              (iVar30 - iVar6 < (ms_params_00->mv_limits).col_min)) ||
             ((ms_params_00->mv_limits).col_max < iVar30 + iVar6)) {
            calc_sad_update_bestmv_with_indices
                      (ms_params_00,pMVar31,local_70,FVar12,puVar24,&local_ac,&local_b0,iVar18,
                       &best_site_1,(int)&best_site,(int *)0x0,(int *)puVar36);
          }
          else {
            calc_sad3_update_bestmv
                      (ms_params_00,pMVar31,local_70,FVar12,puVar24,&local_ac,&local_b0,iVar18,
                       &best_site_1,&best_site,(int *)0x0);
          }
          ms_params_00 = local_68;
          pMVar31 = local_60;
          if ((long)best_site_1 == -1) break;
          uVar16 = (ulong)(&best_site)[best_site_1];
          uVar15 = uVar15 + (int)local_a8->site[uVar8][uVar16].mv.row;
          uVar7 = iVar30 + local_a8->site[uVar8][uVar16].mv.col;
          puVar24 = puVar24 + local_a8->site[uVar8][uVar16].offset;
        }
      }
      uVar8 = uVar8 - 1;
    } while ((int)local_94 < iVar18);
    best_mv = local_70;
    uVar15 = local_88;
    uVar7 = (int)local_94 - 1;
  }
  iVar6 = (int)uVar22;
  cVar35 = uVar7 != 0;
  if ((!(bool)cVar35) && ((*local_a0 = local_b0, local_54 == 0 || (uVar15 != 0)))) {
    local_90 = (uint8_t *)CONCAT71(local_90._1_7_,cVar35);
    uVar15 = (uint)uVar34;
    FVar12 = (FULLPEL_MV)(uVar15 & 0xffff | iVar6 << 0x10);
    if (((ms_params_00->mv_limits).row_min < (int)uVar15) &&
       ((((int)uVar15 < (ms_params_00->mv_limits).row_max &&
         ((ms_params_00->mv_limits).col_min < iVar6)) && (iVar6 < (ms_params_00->mv_limits).col_max)
        ))) {
      calc_sad4_update_bestmv
                (ms_params_00,pMVar31,best_mv,FVar12,puVar24,&local_ac,&local_b0,0,&best_site_1,0,
                 (int *)local_a0);
    }
    else {
      puVar36 = local_a0;
      calc_sad_update_bestmv
                (ms_params_00,pMVar31,best_mv,FVar12,puVar24,&local_ac,&local_b0,0,&best_site_1,4,0,
                 (int *)local_a0);
    }
    lVar9 = (long)best_site_1;
    if (lVar9 == -1) {
      cVar35 = (char)local_90;
    }
    else {
      uVar15 = uVar15 + (int)local_a8->site[0][lVar9].mv.row;
      iVar6 = iVar6 + local_a8->site[0][lVar9].mv.col;
      iVar18 = local_a8->site[0][lVar9].offset;
      while( true ) {
        puVar24 = puVar24 + iVar18;
        best_site_1 = -1;
        local_80 = (int)lVar9;
        iVar18 = local_80;
        if (local_80 == 0) {
          iVar18 = local_a8->searches_per_step[0];
        }
        best_site = iVar18 + -1;
        local_7c = local_80 + 1;
        if (local_80 == local_a8->searches_per_step[0] + -1) {
          local_7c = 0;
        }
        local_a0[1] = 0x7fffffff;
        local_a0[2] = 0x7fffffff;
        local_a0[3] = 0x7fffffff;
        local_a0[4] = 0x7fffffff;
        uVar7 = local_80 + 5;
        if (-1 < (int)(local_80 + 2U)) {
          uVar7 = local_80 + 2U;
        }
        local_a0[(long)(int)((local_80 - (uVar7 & 0xfffffffc)) + 2) + 1] = *local_a0;
        *local_a0 = local_b0;
        FVar12 = (FULLPEL_MV)(uVar15 & 0xffff | iVar6 << 0x10);
        if (((((ms_params_00->mv_limits).row_min < (int)uVar15) &&
             ((int)uVar15 < (ms_params_00->mv_limits).row_max)) &&
            ((ms_params_00->mv_limits).col_min < iVar6)) &&
           (iVar6 < (ms_params_00->mv_limits).col_max)) {
          calc_sad3_update_bestmv
                    (ms_params_00,pMVar31,best_mv,FVar12,puVar24,&local_ac,&local_b0,0,&best_site_1,
                     &best_site,(int *)local_a0);
        }
        else {
          calc_sad_update_bestmv_with_indices
                    (ms_params_00,pMVar31,best_mv,FVar12,puVar24,&local_ac,&local_b0,0,&best_site_1,
                     (int)&best_site,(int *)local_a0,(int *)puVar36);
        }
        if ((long)best_site_1 == -1) break;
        lVar9 = (long)(&best_site)[best_site_1];
        uVar15 = uVar15 + (int)local_a8->site[0][lVar9].mv.row;
        iVar6 = iVar6 + local_a8->site[0][lVar9].mv.col;
        iVar18 = local_a8->site[0][lVar9].offset;
      }
      uVar34 = (ulong)uVar15;
      cVar35 = (char)local_90;
    }
  }
LAB_001dbe5f:
  best_mv->row = (int16_t)uVar34;
  sVar13 = (short)iVar6;
  best_mv->col = sVar13;
  pbVar32 = (ms_params_00->ms_buffers).ref;
  pbVar17 = (ms_params_00->ms_buffers).src;
  if (local_a0 != (uint *)0x0) {
    FVar12 = *best_mv;
    local_a8 = (search_site_config *)(ulong)(uint)FVar12;
    puVar24 = (uint8_t *)(ulong)((uint)FVar12 >> 0x10);
    if (cVar35 != '\0') {
      local_94 = (FULLPEL_MV)pbVar32->stride;
      iVar18 = (int)FVar12 >> 0x10;
      iVar6 = (int)FVar12.row;
      local_90 = (uint8_t *)(ulong)((uint)FVar12 >> 0x10);
      uVar15 = (*ms_params_00->sdf)
                         (pbVar17->buf,pbVar17->stride,
                          pbVar32->buf + ((int)local_94 * iVar6 + iVar18),(int)local_94);
      puVar36 = local_a0;
      *local_a0 = uVar15;
      if ((((ms_params_00->mv_limits).row_min < iVar6) &&
          (iVar6 < (ms_params_00->mv_limits).row_max)) &&
         (((ms_params_00->mv_limits).col_min < iVar18 &&
          (iVar18 < (ms_params_00->mv_limits).col_max)))) {
        lVar9 = 0;
        do {
          uVar15 = (*ms_params_00->sdf)
                             (pbVar17->buf,pbVar17->stride,
                              pbVar32->buf +
                              ((int)(short)((&DAT_004e1852)[lVar9 * 2] + (short)local_90) +
                              (int)(short)((&calc_int_sad_list_neighbors)[lVar9 * 2] +
                                          (short)local_a8) * pbVar32->stride),(int)local_94);
          puVar36[lVar9 + 1] = uVar15;
          lVar9 = lVar9 + 1;
          puVar24 = local_90;
        } while (lVar9 != 4);
      }
      else {
        lVar9 = 0;
        puVar24 = local_90;
        do {
          iVar6 = (int)(short)((&DAT_004e1852)[lVar9 * 2] + (short)puVar24);
          uVar15 = 0x7fffffff;
          if (((ms_params_00->mv_limits).col_min <= iVar6) &&
             (iVar6 <= (ms_params_00->mv_limits).col_max)) {
            iVar18 = (int)(short)((&calc_int_sad_list_neighbors)[lVar9 * 2] + (short)local_a8);
            if (((ms_params_00->mv_limits).row_min <= iVar18) &&
               (iVar18 <= (ms_params_00->mv_limits).row_max)) {
              uVar15 = (*ms_params_00->sdf)
                                 (pbVar17->buf,pbVar17->stride,
                                  pbVar32->buf + (iVar18 * pbVar32->stride + iVar6),(int)local_94);
              puVar24 = local_90;
            }
          }
          local_a0[lVar9 + 1] = uVar15;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
      }
    }
    bVar1 = (ms_params_00->mv_cost_params).mv_cost_type;
    sVar13 = (short)local_a8 - (ms_params_00->mv_cost_params).full_ref_mv.row;
    local_a8 = (search_site_config *)CONCAT62((int6)((ulong)local_a8 >> 0x10),sVar13);
    uVar14 = sVar13 * 8;
    sVar10 = (short)puVar24 - (ms_params_00->mv_cost_params).full_ref_mv.col;
    uVar11 = sVar10 * 8;
    switch(bVar1) {
    case 0:
      uVar15 = ((ms_params_00->mv_cost_params).mvcost[0][(short)uVar14] +
                *(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                        (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar14 != 0) * 8)) +
               (ms_params_00->mv_cost_params).mvcost[1][(short)uVar11]) *
               (ms_params_00->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar20 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar20 = uVar11;
      }
      uVar15 = ((uint)uVar20 + (uint)uVar23) * 4;
      break;
    case 2:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar20 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar20 = uVar11;
      }
      uVar15 = ((uint)uVar20 + (uint)uVar23) * 0xf >> 3;
      break;
    case 3:
      uVar23 = sVar13 * -8;
      if ((short)(sVar13 * -8) < 0) {
        uVar23 = uVar14;
      }
      uVar20 = sVar10 * -8;
      if ((short)(sVar10 * -8) < 0) {
        uVar20 = uVar11;
      }
      uVar15 = (uint)uVar20 + (uint)uVar23;
      break;
    default:
      uVar15 = 0;
    }
    *local_a0 = *local_a0 + uVar15;
    if (local_a0[1] != 0x7fffffff) {
      if (bVar1 < 4) {
        uVar23 = sVar10 * 8 - 8;
        switch(bVar1) {
        case 0:
          uVar15 = ((ms_params_00->mv_cost_params).mvcost[0][(short)uVar14] +
                    *(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar23 != 0) * 4 + (uint)(uVar14 != 0) * 8)) +
                   (ms_params_00->mv_cost_params).mvcost[1][(short)uVar23]) *
                   (ms_params_00->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar25 = -uVar23;
          if (0 < (short)uVar23) {
            uVar25 = uVar23;
          }
          uVar15 = ((uint)uVar25 + (uint)uVar20) * 4;
          break;
        case 2:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar25 = -uVar23;
          if (0 < (short)uVar23) {
            uVar25 = uVar23;
          }
          uVar15 = ((uint)uVar25 + (uint)uVar20) * 0xf >> 3;
          break;
        case 3:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar25 = -uVar23;
          if (0 < (short)uVar23) {
            uVar25 = uVar23;
          }
          uVar15 = (uint)uVar25 + (uint)uVar20;
        }
      }
      else {
        uVar15 = 0;
      }
      local_a0[1] = uVar15 + local_a0[1];
    }
    if (local_a0[2] != 0x7fffffff) {
      if (bVar1 < 4) {
        uVar23 = sVar13 * 8 + 8;
        switch(bVar1) {
        case 0:
          uVar15 = ((ms_params_00->mv_cost_params).mvcost[0][(short)uVar23] +
                    *(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar23 != 0) * 8)) +
                   (ms_params_00->mv_cost_params).mvcost[1][(short)uVar11]) *
                   (ms_params_00->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar20 = -uVar23;
          if (0 < (short)uVar23) {
            uVar20 = uVar23;
          }
          uVar23 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar23 = uVar11;
          }
          uVar15 = ((uint)uVar23 + (uint)uVar20) * 4;
          break;
        case 2:
          uVar20 = -uVar23;
          if (0 < (short)uVar23) {
            uVar20 = uVar23;
          }
          uVar23 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar23 = uVar11;
          }
          uVar15 = ((uint)uVar23 + (uint)uVar20) * 0xf >> 3;
          break;
        case 3:
          uVar20 = -uVar23;
          if (0 < (short)uVar23) {
            uVar20 = uVar23;
          }
          uVar23 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar23 = uVar11;
          }
          uVar15 = (uint)uVar23 + (uint)uVar20;
        }
      }
      else {
        uVar15 = 0;
      }
      local_a0[2] = uVar15 + local_a0[2];
    }
    if (local_a0[3] != 0x7fffffff) {
      if (bVar1 < 4) {
        uVar23 = sVar10 * 8 + 8;
        switch(bVar1) {
        case 0:
          uVar15 = ((ms_params_00->mv_cost_params).mvcost[0][(short)uVar14] +
                    *(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar23 != 0) * 4 + (uint)(uVar14 != 0) * 8)) +
                   (ms_params_00->mv_cost_params).mvcost[1][(short)uVar23]) *
                   (ms_params_00->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar14 = -uVar23;
          if (0 < (short)uVar23) {
            uVar14 = uVar23;
          }
          uVar15 = ((uint)uVar14 + (uint)uVar20) * 4;
          break;
        case 2:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar14 = -uVar23;
          if (0 < (short)uVar23) {
            uVar14 = uVar23;
          }
          uVar15 = ((uint)uVar14 + (uint)uVar20) * 0xf >> 3;
          break;
        case 3:
          uVar20 = sVar13 * -8;
          if ((short)(sVar13 * -8) < 0) {
            uVar20 = uVar14;
          }
          uVar14 = -uVar23;
          if (0 < (short)uVar23) {
            uVar14 = uVar23;
          }
          uVar15 = (uint)uVar14 + (uint)uVar20;
        }
      }
      else {
        uVar15 = 0;
      }
      local_a0[3] = uVar15 + local_a0[3];
    }
    if (local_a0[4] != 0x7fffffff) {
      if (bVar1 < 4) {
        uVar14 = sVar13 * 8 - 8;
        switch(bVar1) {
        case 0:
          uVar15 = ((ms_params_00->mv_cost_params).mvcost[0][(short)uVar14] +
                    *(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar14 != 0) * 8)) +
                   (ms_params_00->mv_cost_params).mvcost[1][(short)uVar11]) *
                   (ms_params_00->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar23 = -uVar14;
          if (0 < (short)uVar14) {
            uVar23 = uVar14;
          }
          uVar14 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar14 = uVar11;
          }
          uVar15 = ((uint)uVar14 + (uint)uVar23) * 4;
          break;
        case 2:
          uVar23 = -uVar14;
          if (0 < (short)uVar14) {
            uVar23 = uVar14;
          }
          uVar14 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar14 = uVar11;
          }
          uVar15 = ((uint)uVar14 + (uint)uVar23) * 0xf >> 3;
          break;
        case 3:
          uVar23 = -uVar14;
          if (0 < (short)uVar14) {
            uVar23 = uVar14;
          }
          uVar14 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar14 = uVar11;
          }
          uVar15 = (uint)uVar14 + (uint)uVar23;
        }
      }
      else {
        uVar15 = 0;
      }
      local_a0[4] = uVar15 + local_a0[4];
    }
    sVar13 = local_70->col;
    pbVar32 = (ms_params_00->ms_buffers).ref;
    pbVar17 = (ms_params_00->ms_buffers).src;
    best_mv = local_70;
  }
  pMVar31 = local_60;
  sVar10 = best_mv->row;
  uVar15 = (*ms_params_00->vfp->vf)
                     (pbVar17->buf,pbVar17->stride,
                      pbVar32->buf + ((int)sVar13 + pbVar32->stride * (int)sVar10),pbVar32->stride,
                      &best_mv_stats->sse);
  best_mv_stats->distortion = uVar15;
  MVar2 = (ms_params_00->mv_cost_params).mv_cost_type;
  iVar6 = 0;
  if (MVar2 != '\x04') {
    sVar3 = pMVar31->ref_mv->row;
    sVar4 = pMVar31->ref_mv->col;
    sVar10 = (short)((int)sVar10 << 3);
    sVar26 = sVar10 - sVar3;
    sVar28 = sVar13 * 8 - sVar4;
    sVar27 = -sVar26;
    if (0 < sVar26) {
      sVar27 = sVar26;
    }
    sVar29 = -sVar28;
    if (0 < sVar28) {
      sVar29 = sVar28;
    }
    if (MVar2 == '\x03') {
      iVar6 = (int)sVar29 + (int)sVar27 >> 3;
    }
    else if (MVar2 == '\x01') {
      iVar6 = (int)sVar29 + (int)sVar27 >> 2;
    }
    else if (MVar2 == '\0') {
      iVar6 = (int)(((long)(ms_params_00->mv_cost_params).mvcost[1][sVar28] +
                     (long)(ms_params_00->mv_cost_params).mvcost[0][sVar26] +
                    (long)*(int *)((long)(ms_params_00->mv_cost_params).mvjcost +
                                  (ulong)((uint)((short)(sVar13 * 8) != sVar4) * 4 +
                                         (uint)(sVar10 != sVar3) * 8))) *
                    (long)(ms_params_00->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
    }
  }
  best_mv_stats->err_cost = iVar6;
  return uVar15 + iVar6;
}

Assistant:

static int pattern_search(FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          int search_step, const int do_init_search,
                          int *cost_list, FULLPEL_MV *best_mv,
                          FULLPEL_MV_STATS *best_mv_stats) {
  static const int search_steps[MAX_MVSEARCH_STEPS] = {
    10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0,
  };
  int i, s, t;

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site_config *search_sites = ms_params->search_sites;
  const int *num_candidates = search_sites->searches_per_step;
  const int ref_stride = ref->stride;
  const int last_is_4 = num_candidates[0] == 4;
  int br, bc;
  unsigned int bestsad = UINT_MAX, raw_bestsad = UINT_MAX;
  int k = -1;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  search_step = AOMMIN(search_step, MAX_MVSEARCH_STEPS - 1);
  assert(search_step >= 0);
  int best_init_s = search_steps[search_step];
  // adjust ref_mv to make sure it is within MV range
  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  br = start_mv.row;
  bc = start_mv.col;
  if (cost_list != NULL) {
    cost_list[0] = cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] =
        INT_MAX;
  }
  int costlist_has_sad = 0;

  // Work out the start point for the search
  raw_bestsad = get_mvpred_sad(ms_params, src,
                               get_buf_from_fullmv(ref, &start_mv), ref_stride);
  bestsad = raw_bestsad + mvsad_err_cost_(&start_mv, mv_cost_params);

  // Search all possible scales up to the search param around the center point
  // pick the scale of the point that is best as the starting scale of
  // further steps around it.
  const uint8_t *center_address = get_buf_from_fullmv(ref, &start_mv);
  if (do_init_search) {
    s = best_init_s;
    best_init_s = -1;
    for (t = 0; t <= s; ++t) {
      int best_site = -1;
      FULLPEL_MV center_mv = { br, bc };
      if (check_bounds(&ms_params->mv_limits, br, bc, 1 << t)) {
        // Call 4-point sad for multiples of 4 candidates.
        const int no_of_4_cand_loops = num_candidates[t] >> 2;
        for (i = 0; i < no_of_4_cand_loops; i++) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, t,
                                  &best_site, i * 4, /*cost_list=*/NULL);
        }
        // Rest of the candidates
        const int remaining_cand = num_candidates[t] % 4;
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, remaining_cand,
                               no_of_4_cand_loops * 4, NULL);
      } else {
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, num_candidates[t], 0, NULL);
      }
      if (best_site == -1) {
        continue;
      } else {
        best_init_s = t;
        k = best_site;
      }
    }
    if (best_init_s != -1) {
      br += search_sites->site[best_init_s][k].mv.row;
      bc += search_sites->site[best_init_s][k].mv.col;
      center_address += search_sites->site[best_init_s][k].offset;
    }
  }

  // If the center point is still the best, just skip this and move to
  // the refinement step.
  if (best_init_s != -1) {
    const int last_s = (last_is_4 && cost_list != NULL);
    int best_site = -1;
    s = best_init_s;

    for (; s >= last_s; s--) {
      // No need to search all points the 1st time if initial search was used
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          // Call 4-point sad for multiples of 4 candidates.
          const int no_of_4_cand_loops = num_candidates[s] >> 2;
          for (i = 0; i < no_of_4_cand_loops; i++) {
            calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv,
                                    center_mv, center_address, &bestsad,
                                    &raw_bestsad, s, &best_site, i * 4,
                                    /*cost_list=*/NULL);
          }
          // Rest of the candidates
          const int remaining_cand = num_candidates[s] % 4;
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, remaining_cand,
                                 no_of_4_cand_loops * 4, NULL);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, num_candidates[s], 0, NULL);
        }

        if (best_site == -1) {
          continue;
        } else {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }

      do {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, NULL);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, NULL);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      } while (best_site != -1);
    }
    // Note: If we enter the if below, then cost_list must be non-NULL.
    if (s == 0) {
      cost_list[0] = raw_bestsad;
      costlist_has_sad = 1;
      assert(num_candidates[s] == 4);
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, 0, cost_list);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, /*num_candidates=*/4,
                                 /*cand_start=*/0, cost_list);
        }

        if (best_site != -1) {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }
      while (best_site != -1) {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;
        cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] = INT_MAX;
        cost_list[((k + 2) % 4) + 1] = cost_list[0];
        cost_list[0] = raw_bestsad;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          assert(PATTERN_CANDIDATES_REF == 3);
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, cost_list);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, cost_list);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      }
    }
  }
  best_mv->row = br;
  best_mv->col = bc;

  assert(center_address == get_buf_from_fullmv(ref, best_mv) &&
         "center address is out of sync with best_mv!\n");

  // Returns the one-away integer pel cost/sad around the best as follows:
  // cost_list[0]: cost/sad at the best integer pel
  // cost_list[1]: cost/sad at delta {0, -1} (left)   from the best integer pel
  // cost_list[2]: cost/sad at delta { 1, 0} (bottom) from the best integer pel
  // cost_list[3]: cost/sad at delta { 0, 1} (right)  from the best integer pel
  // cost_list[4]: cost/sad at delta {-1, 0} (top)    from the best integer pel
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }

  const int var_cost = get_mvpred_var_cost(ms_params, best_mv, best_mv_stats);
  return var_cost;
}